

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_qrdmlah_s32_arm(void *vd,void *vn,void *vm,void *ve,uint32_t desc)

{
  uint32_t uVar1;
  ulong opr_sz_00;
  uintptr_t max_sz;
  undefined8 local_60;
  uintptr_t i;
  CPUARMState *env;
  int32_t *m;
  int32_t *n;
  int32_t *d;
  uintptr_t opr_sz;
  uint32_t desc_local;
  void *ve_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  for (local_60 = 0; local_60 < opr_sz_00 >> 2; local_60 = local_60 + 1) {
    uVar1 = helper_neon_qrdmlah_s32_arm
                      ((CPUARMState *)ve,*(int32_t *)((long)vn + local_60 * 4),
                       *(int32_t *)((long)vm + local_60 * 4),*(int32_t *)((long)vd + local_60 * 4));
    *(uint32_t *)((long)vd + local_60 * 4) = uVar1;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_qrdmlah_s32)(void *vd, void *vn, void *vm,
                              void *ve, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    int32_t *d = vd;
    int32_t *n = vn;
    int32_t *m = vm;
    CPUARMState *env = ve;
    uintptr_t i;

    for (i = 0; i < opr_sz / 4; ++i) {
        d[i] = helper_neon_qrdmlah_s32(env, n[i], m[i], d[i]);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}